

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * LoadFrameLong(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  ulong value_00;
  bool bVar1;
  longlong value;
  uint offset_local;
  Storage *storage_local;
  InstructionVMEvalContext *ctx_local;
  VmType type_local;
  
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,8);
  if (bVar1) {
    value_00 = *(ulong *)((storage->data).data + offset);
    ctx_local._0_4_ = type.type;
    if ((VmValueType)ctx_local == VM_TYPE_POINTER) {
      if ((value_00 & 0xffffffff) != value_00) {
        __assert_fail("unsigned(value) == value",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                      ,0xdd,
                      "VmConstant *LoadFrameLong(InstructionVMEvalContext &, InstructionVMEvalContext::Storage *, unsigned int, VmType)"
                     );
      }
      type_local.structType =
           (TypeBase *)
           CreateConstantPointer
                     (ctx->allocator,(SynBase *)0x0,(int)value_00,(VariableData *)0x0,
                      type.structType,false);
    }
    else {
      type_local.structType = (TypeBase *)CreateConstantLong(ctx->allocator,(SynBase *)0x0,value_00)
      ;
    }
  }
  else {
    type_local.structType =
         (TypeBase *)anon_unknown.dwarf_baae3::Report(ctx,"ERROR: out of stack space");
  }
  return (VmConstant *)type_local.structType;
}

Assistant:

VmConstant* LoadFrameLong(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	long long value = 0;
	if(!storage->Reserve(ctx, offset, sizeof(value)))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(&value, storage->data.data + offset, sizeof(value));

	if(type.type == VM_TYPE_POINTER)
	{
		assert(unsigned(value) == value);

		return CreateConstantPointer(ctx.allocator, NULL, unsigned(value), NULL, type.structType, false);
	}

	return CreateConstantLong(ctx.allocator, NULL, value);
}